

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::EmitDerefOp(SQCompiler *this,SQOpcode op)

{
  SQFuncState *this_00;
  SQInteger SVar1;
  SQInteger SVar2;
  SQInteger SVar3;
  SQInteger SVar4;
  SQInstruction local_30;
  
  SVar1 = SQFuncState::PopTarget(this->_fs);
  SVar2 = SQFuncState::PopTarget(this->_fs);
  SVar3 = SQFuncState::PopTarget(this->_fs);
  this_00 = this->_fs;
  SVar4 = SQFuncState::PushTarget(this_00,-1);
  local_30._arg0 = (uchar)SVar4;
  local_30._arg1 = (SQInt32)SVar3;
  local_30._arg2 = (uchar)SVar2;
  local_30._arg3 = (uchar)SVar1;
  local_30.op = (uchar)op;
  SQFuncState::AddInstruction(this_00,&local_30);
  return;
}

Assistant:

void EmitDerefOp(SQOpcode op)
    {
        SQInteger val = _fs->PopTarget();
        SQInteger key = _fs->PopTarget();
        SQInteger src = _fs->PopTarget();
        _fs->AddInstruction(op,_fs->PushTarget(),src,key,val);
    }